

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

tuple<SudokuGitter,_SudokuGitter> *
mainBigSudoku(tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,int elements)

{
  _List_node_base *p_Var1;
  SudokuGitter gitter2;
  SudokuGitter gitter1;
  SudokuGenerator generator;
  SudokuGitter local_128;
  SudokuGitter local_100;
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  local_d8;
  SudokuGitter local_c0;
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  local_98;
  undefined8 local_80;
  uint local_78;
  SudokuGenerator local_70;
  
  SudokuGenerator::SudokuGenerator(&local_70,elements);
  SudokuGenerator::generateNewBig(__return_storage_ptr__,&local_70);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&local_100.cells,
           (vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            *)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
               super__Head_base<0UL,_SudokuGitter,_false>);
  local_100.quadHeight =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.quadHeight;
  local_100.elements =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.elements;
  local_100.quadWidth =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&local_128.cells,
           (vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            *)__return_storage_ptr__);
  local_128.quadHeight =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
       quadHeight;
  local_128.elements =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
       elements;
  local_128.quadWidth =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
       quadWidth;
  SudokuGitter::getSolvable(&local_c0,&local_100);
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_100.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_100.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_100.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_100.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_100.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_100.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_d8);
  local_100.quadHeight = local_c0.quadHeight;
  local_100.elements = local_c0.elements;
  local_100.quadWidth = local_c0.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_c0.cells);
  SudokuGitter::getSolvable(&local_c0,&local_128);
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_128.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_128.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_128.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_d8);
  local_128.quadHeight = local_c0.quadHeight;
  local_128.elements = local_c0.elements;
  local_128.quadWidth = local_c0.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_c0.cells);
  std::_Tuple_impl<0ul,SudokuGitter,SudokuGitter>::_Tuple_impl<SudokuGitter&,SudokuGitter&,void>
            ((_Tuple_impl<0ul,SudokuGitter,SudokuGitter> *)&local_c0,&local_100,&local_128);
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
                super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.cells.
                super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                ._M_impl.super__Vector_impl_data + 8);
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
                super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.cells.
                super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                ._M_impl.super__Vector_impl_data + 0x10);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
           super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.cells.
           super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) =
       local_98.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
           super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.cells.
           super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       local_98.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_d8);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.quadHeight = local_78;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.elements = (undefined4)local_80;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.quadWidth = local_80._4_4_;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
         super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
         _M_head_impl.cells.
         super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
         ._M_impl;
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
                super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
                _M_head_impl.cells.
                super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                ._M_impl + 8);
  local_d8.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
                super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
                _M_head_impl.cells.
                super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                ._M_impl + 0x10);
  *(pointer *)
   &(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
    super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
    cells.
    super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ._M_impl = local_c0.cells.
               super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
           super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
           _M_head_impl.cells.
           super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
           ._M_impl + 8) =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
           super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
           _M_head_impl.cells.
           super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
           ._M_impl + 0x10) =
       local_c0.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_d8);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
  quadHeight = local_c0.quadHeight;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
  elements = local_c0.elements;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
  super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
  quadWidth = local_c0.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_c0.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_128.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_100.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_70.gitter.cells);
  while (local_70.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_70.errorInRow) {
    p_Var1 = (local_70.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_70.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next);
    local_70.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var1;
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> mainBigSudoku(int elements){
    SudokuGenerator generator = SudokuGenerator(elements);
    tuple<SudokuGitter, SudokuGitter> bigGitter = generator.generateNewBig();
    SudokuGitter gitter1 = std::get<0>(bigGitter);
    SudokuGitter gitter2 = std::get<1>(bigGitter);
    gitter1 = gitter1.getSolvable();
    gitter2 = gitter2.getSolvable();
    bigGitter = std::make_tuple(gitter1, gitter2);
    return bigGitter;
}